

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::
BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true,_true>
                  *this,Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                        *xpr,Index i)

{
  Scalar *ptr;
  Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
  *pTVar1;
  Index in_RDX;
  EVP_PKEY_CTX *in_RSI;
  BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true,_true>
  *in_RDI;
  MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true>,_0>
  *unaff_retaddr;
  Index in_stack_ffffffffffffffd8;
  BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_1,__1,_true,_true>
  *dataPtr;
  
  dataPtr = in_RDI;
  ptr = TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>,_Eigen::Dense>
        ::coeffRef((TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_Eigen::Dense>
                    *)in_RDI,in_stack_ffffffffffffffd8,0x2ec270);
  pTVar1 = (Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
            *)const_cast_ptr<double>(ptr);
  Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>
  ::cols((Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
          *)0x2ec286);
  MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_1,_-1,_true>,_0>
  ::MapBase(unaff_retaddr,(PointerType)dataPtr,(Index)in_RSI,in_RDX);
  Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>
  ::Transpose((Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
               *)in_RDI,pTVar1);
  init(in_RDI,in_RSI);
  return;
}

Assistant:

inline BlockImpl_dense(XprType& xpr, Index i)
      : Base(internal::const_cast_ptr(&xpr.coeffRef(
              (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0,
              (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr)
    {
      init();
    }